

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O2

void __thiscall
json11::Value<(json11::Json::Type)4,_std::vector<json11::Json,_std::allocator<json11::Json>_>_>::
dump(Value<(json11::Json::Type)4,_std::vector<json11::Json,_std::allocator<json11::Json>_>_> *this,
    string *out)

{
  pointer pJVar1;
  element_type *peVar2;
  bool bVar3;
  Json *value;
  pointer pJVar4;
  
  std::__cxx11::string::append((char *)out);
  pJVar1 = (this->m_value).super__Vector_base<json11::Json,_std::allocator<json11::Json>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar3 = true;
  for (pJVar4 = (this->m_value).super__Vector_base<json11::Json,_std::allocator<json11::Json>_>.
                _M_impl.super__Vector_impl_data._M_start; pJVar4 != pJVar1; pJVar4 = pJVar4 + 1) {
    if (!bVar3) {
      std::__cxx11::string::append((char *)out);
    }
    peVar2 = (pJVar4->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*peVar2->_vptr_JsonValue[3])(peVar2,out);
    bVar3 = false;
  }
  std::__cxx11::string::append((char *)out);
  return;
}

Assistant:

void dump(string &out) const override { json11::dump(m_value, out); }